

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTestInstance::drawCommand
          (BuiltinVariableRenderTestInstance *this,VkCommandBuffer *cmdBuffer)

{
  DeviceInterface *pDVar1;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_GeometryExpanderRenderTestInstance).super_TestInstance.m_context)
  ;
  if (this->m_indicesTest == true) {
    (*pDVar1->_vptr_DeviceInterface[0x57])
              (pDVar1,*cmdBuffer,
               (this->m_indicesBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,0);
    (*pDVar1->_vptr_DeviceInterface[0x5a])
              (pDVar1,*cmdBuffer,
               (ulong)((long)(this->m_indices).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_indices).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 1,1,0,0,0);
    return;
  }
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,*cmdBuffer,
             (ulong)(uint)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices,1,0,0);
  return;
}

Assistant:

void BuiltinVariableRenderTestInstance::drawCommand (const VkCommandBuffer&	cmdBuffer)
{
	const DeviceInterface&	vk = m_context.getDeviceInterface();
	if (m_indicesTest)
	{
		vk.cmdBindIndexBuffer(cmdBuffer, *m_indicesBuffer, 0, VK_INDEX_TYPE_UINT16);
		vk.cmdDrawIndexed(cmdBuffer, static_cast<deUint32>(m_indices.size()), 1, 0, 0, 0);
	}
	else
		vk.cmdDraw(cmdBuffer, static_cast<deUint32>(m_numDrawVertices), 1u, 0u, 0u);
}